

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O2

void Llb_ManPrepareGroups(Llb_Man_t *pMan)

{
  Vec_Ptr_t *pVVar1;
  Aig_Obj_t *pAVar2;
  Aig_Man_t *pAVar3;
  int iVar4;
  
  if (pMan->vGroups == (Vec_Ptr_t *)0x0) {
    pVVar1 = Vec_PtrAlloc(1000);
    pMan->vGroups = pVVar1;
    Llb_ManGroupCreateFirst(pMan);
    iVar4 = 0;
    while( true ) {
      pAVar3 = pMan->pAig;
      if (pAVar3->vObjs->nSize <= iVar4) break;
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pAVar3->vObjs,iVar4);
      if (((pAVar2 != (Aig_Obj_t *)0x0) && ((*(ulong *)&pAVar2->field_0x18 & 0x10) != 0)) &&
         (0xfffffffd < ((uint)*(ulong *)&pAVar2->field_0x18 & 7) - 7)) {
        Llb_ManGroupCreate(pMan,pAVar2);
      }
      iVar4 = iVar4 + 1;
    }
    for (iVar4 = 0; iVar4 < pAVar3->nRegs; iVar4 = iVar4 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pAVar3->vCos,pAVar3->nTruePos + iVar4);
      if ((pAVar2->field_0x18 & 0x10) != 0) {
        Llb_ManGroupCreate(pMan,pAVar2);
      }
      pAVar3 = pMan->pAig;
    }
    Llb_ManGroupCreateLast(pMan);
    return;
  }
  __assert_fail("pMan->vGroups == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Group.c"
                ,0x168,"void Llb_ManPrepareGroups(Llb_Man_t *)");
}

Assistant:

void Llb_ManPrepareGroups( Llb_Man_t * pMan )
{
    Aig_Obj_t * pObj;
    int i;
    assert( pMan->vGroups == NULL );
    pMan->vGroups = Vec_PtrAlloc( 1000 );
    Llb_ManGroupCreateFirst( pMan );
    Aig_ManForEachNode( pMan->pAig, pObj, i )
    {
        if ( pObj->fMarkA )
            Llb_ManGroupCreate( pMan, pObj );
    }
    Saig_ManForEachLi( pMan->pAig, pObj, i )
    {
        if ( pObj->fMarkA )
            Llb_ManGroupCreate( pMan, pObj );
    }
    Llb_ManGroupCreateLast( pMan );
}